

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O0

int nghttp2_map_insert(nghttp2_map *map,nghttp2_map_key_type key,void *data)

{
  uint32_t tablelen;
  uint32_t tablelenbits;
  nghttp2_map_bucket *table;
  uint32_t hash;
  int rv;
  void *data_local;
  nghttp2_map_key_type key_local;
  nghttp2_map *map_local;
  
  if (data != (void *)0x0) {
    if (((map->size + 1) * 4 <= (ulong)(map->tablelen * 3)) ||
       (map_local._4_4_ = map_resize(map,map->tablelen << 1,map->tablelenbits + 1),
       map_local._4_4_ == 0)) {
      table = map->table;
      tablelen = map->tablelen;
      tablelenbits = map->tablelenbits;
      hash = ::hash(key);
      map_local._4_4_ = insert(table,tablelen,tablelenbits,hash,key,data);
      if (map_local._4_4_ == 0) {
        map->size = map->size + 1;
        map_local._4_4_ = 0;
      }
    }
    return map_local._4_4_;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_map.c"
                ,0xde,"int nghttp2_map_insert(nghttp2_map *, nghttp2_map_key_type, void *)");
}

Assistant:

int nghttp2_map_insert(nghttp2_map *map, nghttp2_map_key_type key, void *data) {
  int rv;

  assert(data);

  /* Load factor is 0.75 */
  if ((map->size + 1) * 4 > map->tablelen * 3) {
    rv = map_resize(map, map->tablelen * 2, map->tablelenbits + 1);
    if (rv != 0) {
      return rv;
    }
  }

  rv = insert(map->table, map->tablelen, map->tablelenbits, hash(key), key,
              data);
  if (rv != 0) {
    return rv;
  }
  ++map->size;
  return 0;
}